

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

complex<float>
TPZMatrix<std::complex<float>_>::ReturnNearestValue
          (complex<float> val,TPZVec<std::complex<float>_> *Vec,complex<float> tol)

{
  complex<float> *pcVar1;
  int64_t iVar2;
  TPZVec<std::complex<float>_> *in_RDI;
  double __x;
  double dVar3;
  double dVar4;
  double extraout_XMM0_Qa;
  double __x_00;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  int64_t i;
  complex<float> diff1;
  complex<float> diff0;
  complex<float> exps;
  complex<float> res;
  complex<float> *in_stack_ffffffffffffff48;
  complex<float> *local_b0;
  _ComplexT local_60;
  complex<float> local_58;
  _ComplexT local_50;
  double local_48;
  complex<float> local_38;
  _ComplexT local_30;
  TPZVec<std::complex<float>_> *local_20;
  double local_18;
  _ComplexT local_8;
  
  local_18 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  local_20 = in_RDI;
  pcVar1 = TPZVec<std::complex<float>_>::operator[](in_RDI,0);
  local_30 = pcVar1->_M_value;
  std::operator-(in_stack_ffffffffffffff48,(complex<float> *)0x12abe02);
  dVar3 = fabs(__x);
  local_48 = local_18;
  dVar4 = fabs(local_18);
  if (SUB84(dVar3,0) < SUB84(dVar4,0)) {
    std::complex<float>::complex(&local_38,1e+10,0.0);
  }
  else {
    pcVar1 = TPZVec<std::complex<float>_>::operator[](local_20,0);
    local_50 = pcVar1->_M_value;
    std::operator-(in_stack_ffffffffffffff48,(complex<float> *)0x12abe7a);
    local_38._M_value = (_ComplexT)extraout_XMM0_Qa;
  }
  std::complex<float>::complex(&local_58,0.0,0.0);
  pcVar1 = TPZVec<std::complex<float>_>::operator[](local_20,0);
  local_8 = pcVar1->_M_value;
  local_60 = 1;
  do {
    iVar2 = TPZVec<std::complex<float>_>::NElements(local_20);
    if (iVar2 <= (long)local_60) {
      return (complex<float>)local_60;
    }
    TPZVec<std::complex<float>_>::operator[](local_20,local_60);
    std::operator-(in_stack_ffffffffffffff48,(complex<float> *)0x12abf26);
    local_58._M_value = (_ComplexT)__x_00;
    dVar3 = fabs(__x_00);
    dVar4 = fabs(local_18);
    if (SUB84(dVar3,0) < SUB84(dVar4,0)) {
LAB_012abfde:
      local_b0 = &local_38;
    }
    else {
      dVar3 = fabs((double)local_58._M_value);
      dVar4 = fabs((double)local_38._M_value);
      if (SUB84(dVar4,0) <= SUB84(dVar3,0)) goto LAB_012abfde;
      pcVar1 = TPZVec<std::complex<float>_>::operator[](local_20,local_60);
      local_8 = pcVar1->_M_value;
      local_b0 = &local_58;
    }
    local_38._M_value = local_b0->_M_value;
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

TVar TPZMatrix<TVar>::ReturnNearestValue(TVar val, TPZVec<TVar>& Vec, TVar tol)
{
    TVar exps = val - (TVar)Vec[0];
    TVar diff0 = fabs(exps) >= fabs(tol) ?  (val - (TVar)Vec[0]) : (TVar)1.E10;
    TVar diff1, res = (TVar)Vec[0];
    for(int64_t i = 1; i < Vec.NElements(); i++)
    {
        diff1 = val - (TVar)Vec[i];
        diff0 = ( fabs(diff1) >= fabs(tol) && fabs(diff1) < fabs(diff0) ) ? res = Vec[i],diff1 : diff0;
    }
    return res;
}